

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxingBase.h
# Opt level: O0

string * __thiscall
BoxingBaseWithRW<unsigned_long,STDStreamsReader<unsigned_long>,STDStreamsWriter<unsigned_long>>::
ToString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  STDStreamsWriter<unsigned_long> local_19;
  void *pvStack_18;
  STDStreamsWriter<unsigned_long> writer;
  BoxingBaseWithRW<unsigned_long,_STDStreamsReader<unsigned_long>,_STDStreamsWriter<unsigned_long>_>
  *this_local;
  string *aString;
  
  pvStack_18 = this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  STDStreamsWriter<unsigned_long>::Write(&local_19,(unsigned_long *)this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string BoxingBaseWithRW<U,Reader,Writer>::ToString() const
{
	Writer writer;
	std::string aString;

	writer.Write(this->boxedValue,aString);

	return aString;
}